

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O3

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createIntrinsicCall
          (LLVMReadWriteGraphBuilder *this,CallInst *CInst)

{
  uint uVar1;
  undefined8 uVar2;
  ulong uVar3;
  LLVMPointsToSetImpl *pLVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  raw_ostream *prVar8;
  RWNode *pRVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  undefined1 auVar15 [16];
  pair<std::_Rb_tree_iterator<const_llvm::Value_*>,_bool> pVar16;
  const_iterator __begin2;
  const_iterator __end2;
  const_iterator local_98;
  RWNode *local_90;
  GenericDefSite<dg::dda::RWNode> local_88;
  LLVMReadWriteGraphBuilder *local_70;
  RWNode *local_68;
  ValInfo local_60;
  undefined1 local_58 [16];
  const_iterator local_48;
  char local_40 [8];
  LLVMPointsToSetImpl *local_38;
  
  lVar13 = 0;
  if (*(long *)(*(long *)(CInst + -0x20) + 0x18) == *(long *)(CInst + 0x48)) {
    lVar13 = *(long *)(CInst + -0x20);
  }
  uVar1 = *(int *)(lVar13 + 0x24) - 0xbf;
  if ((5 < uVar1) || ((0x29U >> (uVar1 & 0x1f) & 1) == 0)) {
    if (*(int *)(lVar13 + 0x24) == 0x134) {
      local_90 = ReadWriteGraph::create(&this->graph,ALLOC);
      local_88.offset.offset = 0;
      local_88.len.offset = Offset::UNKNOWN;
      local_88.target = local_90;
      std::
      _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
      ::_M_insert_unique<dg::dda::GenericDefSite<dg::dda::RWNode>const&>
                ((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                  *)&local_90->annotations,&local_88);
      return local_90;
    }
    pRVar9 = createUnknownCall(this,CInst);
    return pRVar9;
  }
  uVar2 = *(undefined8 *)(CInst + -(ulong)(uint)(*(int *)(CInst + 0x14) << 5));
  lVar13 = *(long *)(CInst + -(ulong)(uint)(*(int *)(CInst + 0x14) << 5) + 0x40);
  local_90 = ReadWriteGraph::create(&this->graph,GENERIC);
  (**(code **)(*(long *)this->PTA + 0x10))(local_40,this->PTA,uVar2);
  if (local_40[0] == '\0') {
    prVar8 = (raw_ostream *)llvm::errs();
    Str.Length = 0x39;
    Str.Data = "[RWG] Error: No points-to information for destination in\n";
    llvm::raw_ostream::operator<<(prVar8,Str);
    prVar8 = (raw_ostream *)llvm::errs();
    local_88.target = (RWNode *)CInst;
    prVar8 = operator<<(prVar8,(ValInfo *)&local_88);
    Str_00.Length = 1;
    Str_00.Data = "\n";
    llvm::raw_ostream::operator<<(prVar8,Str_00);
  }
  uVar3 = Offset::UNKNOWN;
  uVar14 = Offset::UNKNOWN;
  local_68 = (RWNode *)CInst;
  if (lVar13 != 0 && *(char *)(lVar13 + 0x10) == '\x10') {
    uVar1 = *(uint *)(lVar13 + 0x20);
    puVar11 = (ulong *)(lVar13 + 0x18);
    if (0x40 < uVar1) {
      iVar7 = llvm::APInt::countLeadingZerosSlowCase();
      uVar14 = 0xffffffffffffffff;
      if (0x40 < uVar1 - iVar7) goto LAB_00114b77;
    }
    if (0x40 < uVar1) {
      puVar11 = (ulong *)*puVar11;
    }
    uVar14 = *puVar11;
  }
LAB_00114b77:
  pLVar4 = local_38;
  if (local_38 == (LLVMPointsToSetImpl *)0x0) {
    local_98.impl = (LLVMPointsToSetImpl *)0x0;
  }
  else {
    cVar5 = (**(code **)(*(long *)local_38 + 0x38))(local_38);
    local_98.impl = (LLVMPointsToSetImpl *)0x0;
    if (cVar5 == '\0') {
      local_98.impl = pLVar4;
    }
  }
  local_48.impl = (LLVMPointsToSetImpl *)0x0;
  bVar6 = LLVMPointsToSet::const_iterator::operator==(&local_98,&local_48);
  if (!bVar6) {
    local_70 = this;
    do {
      auVar15 = (**(code **)(*(long *)local_98.impl + 0x48))();
      uVar10 = auVar15._8_8_;
      local_58 = auVar15;
      if (auVar15._0_8_[0x10] != (Value)0x0) {
        if (uVar3 == uVar10) {
          uVar14 = uVar3;
        }
        uVar12 = uVar3;
        if (uVar14 < uVar3 - uVar10) {
          uVar12 = uVar14 + uVar10;
          if (uVar3 - uVar14 <= uVar10) {
            uVar12 = uVar3;
          }
          if (uVar3 == uVar14) {
            uVar12 = uVar3;
          }
        }
        pRVar9 = getOperand(this,auVar15._0_8_);
        if (pRVar9 == (RWNode *)0x0) {
          if (createIntrinsicCall(llvm::CallInst_const*)::warned == '\0') {
            createIntrinsicCall();
          }
          pVar16 = std::
                   _Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
                   ::_M_insert_unique<llvm::Value_const*const&>
                             ((_Rb_tree<llvm::Value_const*,llvm::Value_const*,std::_Identity<llvm::Value_const*>,std::less<llvm::Value_const*>,std::allocator<llvm::Value_const*>>
                               *)&createIntrinsicCall::warned,(Value **)local_58);
          pRVar9 = UNKNOWN_MEMORY;
          if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            prVar8 = (raw_ostream *)llvm::errs();
            Str_01.Length = 0xf;
            Str_01.Data = "[RWG] error at ";
            prVar8 = llvm::raw_ostream::operator<<(prVar8,Str_01);
            local_88.target = local_68;
            prVar8 = operator<<(prVar8,(ValInfo *)&local_88);
            Str_02.Length = 1;
            Str_02.Data = "\n";
            prVar8 = llvm::raw_ostream::operator<<(prVar8,Str_02);
            Str_03.Length = 0x27;
            Str_03.Data = "[RWG] error: Haven\'t created node for: ";
            prVar8 = llvm::raw_ostream::operator<<(prVar8,Str_03);
            local_60.v = (Value *)local_58._0_8_;
            prVar8 = operator<<(prVar8,&local_60);
            this = local_70;
            Str_04.Length = 1;
            Str_04.Data = "\n";
            llvm::raw_ostream::operator<<(prVar8,Str_04);
            pRVar9 = UNKNOWN_MEMORY;
          }
        }
        if (uVar3 == uVar10) {
          local_88.offset.offset = uVar3;
          lVar13 = 0xa0;
        }
        else {
          lVar13 = 0xa0;
          local_88.offset.offset = uVar10;
          if (uVar12 != uVar3) {
            lVar13 = 0xd0;
          }
        }
        local_88.target = pRVar9;
        local_88.len.offset = uVar12;
        std::
        _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
        ::_M_insert_unique<dg::dda::GenericDefSite<dg::dda::RWNode>const&>
                  ((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                    *)((long)&local_90->_vptr_RWNode + lVar13),&local_88);
      }
      (**(code **)(*(long *)local_98.impl + 0x40))();
      cVar5 = (**(code **)(*(long *)local_98.impl + 0x38))();
      if (cVar5 != '\0') {
        local_98.impl = (LLVMPointsToSetImpl *)0x0;
      }
      bVar6 = LLVMPointsToSet::const_iterator::operator==(&local_98,&local_48);
    } while (!bVar6);
  }
  if (local_38 != (LLVMPointsToSetImpl *)0x0) {
    (**(code **)(*(long *)local_38 + 0x58))();
  }
  return local_90;
}

Assistant:

RWNode *
LLVMReadWriteGraphBuilder::createIntrinsicCall(const llvm::CallInst *CInst) {
    using namespace llvm;

    const IntrinsicInst *I = cast<IntrinsicInst>(CInst);
    const Value *dest;
    const Value *lenVal;

    RWNode *ret;
    switch (I->getIntrinsicID()) {
    case Intrinsic::memmove:
    case Intrinsic::memcpy:
    case Intrinsic::memset:
        // memcpy/set <dest>, <src/val>, <len>
        dest = I->getOperand(0);
        lenVal = I->getOperand(2);
        break;
    case Intrinsic::vastart:
        // we create this node because this nodes works
        // as ALLOC in points-to, so we can have
        // reaching definitions to that
        ret = &create(RWNodeType::ALLOC);
        ret->addDef(ret, 0, Offset::UNKNOWN);
        return ret;
    default:
        return createUnknownCall(CInst);
    }

    ret = &create(RWNodeType::GENERIC);

    auto pts = PTA->getLLVMPointsToChecked(dest);
    if (!pts.first) {
        llvm::errs()
                << "[RWG] Error: No points-to information for destination in\n";
        llvm::errs() << ValInfo(I) << "\n";
        // continue, the points-to set is {unknown}
    }

    uint64_t len = Offset::UNKNOWN;
    if (const ConstantInt *C = dyn_cast<ConstantInt>(lenVal))
        len = C->getLimitedValue();

    for (const auto &ptr : pts.second) {
        if (llvm::isa<llvm::Function>(ptr.value))
            continue;

        Offset from, to;
        if (ptr.offset.isUnknown()) {
            // if the offset is UNKNOWN, use whole memory
            from = Offset::UNKNOWN;
            len = Offset::UNKNOWN;
        } else {
            from = *ptr.offset;
        }

        // do not allow overflow
        if (Offset::UNKNOWN - *from > len)
            to = from + len;
        else
            to = Offset::UNKNOWN;

        RWNode *target = getOperand(ptr.value);
        // assert(target && "Don't have pointer target for intrinsic call");
        if (!target) {
            // keeping such set is faster then printing it all to terminal
            // ... and we don't flood the terminal that way
            static std::set<const llvm::Value *> warned;
            if (warned.insert(ptr.value).second) {
                llvm::errs() << "[RWG] error at " << ValInfo(CInst) << "\n"
                             << "[RWG] error: Haven't created node for: "
                             << ValInfo(ptr.value) << "\n";
            }
            target = UNKNOWN_MEMORY;
        }

        // add the definition
        ret->addDef(target, from, to,
                    !from.isUnknown() && !to.isUnknown() /* strong update */);
    }

    return ret;
}